

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O2

void decompressBlockDiffFlipC
               (uint block_part1,uint block_part2,uint8 *img,int width,int height,int startx,
               int starty,int channels)

{
  uint uVar1;
  int iVar2;
  uint8 *puVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint8 *puVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int y;
  int iVar17;
  uint uVar18;
  
  if ((block_part1 & 2) == 0) {
    iVar17 = (block_part1 >> 0x1c) * 0x11;
    uVar18 = block_part1 >> 4 & 0xe;
    uVar1 = block_part2 >> 0x10;
    uVar9 = block_part2 & 0xffff;
    uVar7 = (block_part1 >> 0x14 & 0xf) << 4 | block_part1 >> 0x14 & 0xf;
    uVar8 = (block_part1 >> 0xc & 0xf) << 4 | block_part1 >> 0xc & 0xf;
    lVar15 = (long)starty;
    lVar14 = (long)width;
    lVar13 = (long)channels;
    lVar16 = (long)startx;
    if ((block_part1 & 1) == 0) {
      puVar11 = img + (lVar15 * lVar14 + lVar16) * lVar13 + 2;
      uVar4 = 0;
      for (; lVar6 = lVar15, puVar3 = puVar11, lVar16 < startx + 2; lVar16 = lVar16 + 1) {
        for (; lVar6 < starty + 4; lVar6 = lVar6 + 1) {
          iVar2 = *(int *)((long)compressParams[0] +
                          (long)unscramble
                                [(uint)((uVar9 >> (uVar4 & 0x1f) & 1) != 0) +
                                 (uVar1 >> ((byte)uVar4 & 0x1f) & 1) * 2] * 4 + (ulong)(uVar18 << 4)
                          );
          iVar10 = iVar2 + iVar17;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          puVar3[-2] = (uint8)iVar10;
          iVar10 = iVar2 + uVar7;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          puVar3[-1] = (uint8)iVar10;
          iVar2 = iVar2 + uVar8;
          if (0xfe < iVar2) {
            iVar2 = 0xff;
          }
          if (iVar2 < 1) {
            iVar2 = 0;
          }
          uVar4 = uVar4 + 1;
          *puVar3 = (uint8)iVar2;
          puVar3 = puVar3 + lVar13 * lVar14;
        }
        puVar11 = puVar11 + lVar13;
      }
    }
    else {
      puVar11 = img + (lVar15 * lVar14 + lVar16) * lVar13 + 2;
      uVar4 = 0;
      for (; puVar3 = puVar11, lVar6 = lVar15, lVar16 < startx + 4; lVar16 = lVar16 + 1) {
        for (; lVar6 < starty + 2; lVar6 = lVar6 + 1) {
          iVar2 = *(int *)((long)compressParams[0] +
                          (long)unscramble
                                [(uint)((uVar9 >> (uVar4 & 0x1f) & 1) != 0) +
                                 (uVar1 >> ((byte)uVar4 & 0x1f) & 1) * 2] * 4 + (ulong)(uVar18 << 4)
                          );
          iVar10 = iVar17 + iVar2;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          puVar3[-2] = (uint8)iVar10;
          iVar10 = uVar7 + iVar2;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          puVar3[-1] = (uint8)iVar10;
          iVar2 = iVar2 + uVar8;
          if (0xfe < iVar2) {
            iVar2 = 0xff;
          }
          if (iVar2 < 1) {
            iVar2 = 0;
          }
          uVar4 = uVar4 + 1;
          *puVar3 = (uint8)iVar2;
          puVar3 = puVar3 + lVar13 * lVar14;
        }
        uVar4 = uVar4 + 2;
        puVar11 = puVar11 + lVar13;
      }
    }
    uVar4 = block_part1 >> 1 & 0xe;
    uVar7 = (block_part1 >> 0x18 & 0xf) << 4 | block_part1 >> 0x18 & 0xf;
    uVar18 = (block_part1 >> 0x10 & 0xf) << 4 | block_part1 >> 0x10 & 0xf;
    uVar8 = (block_part1 >> 8 & 0xf) << 4 | block_part1 >> 8 & 0xf;
    if ((block_part1 & 1) == 0) {
      lVar16 = (long)(startx + 2);
      puVar11 = img + (starty * lVar14 + lVar16) * lVar13 + 2;
      uVar5 = 8;
      for (; lVar15 = (long)starty, puVar3 = puVar11, lVar16 < startx + 4; lVar16 = lVar16 + 1) {
        for (; lVar15 < starty + 4; lVar15 = lVar15 + 1) {
          iVar10 = *(int *)((long)compressParams[0] +
                           (long)unscramble
                                 [(uint)((uVar9 >> (uVar5 & 0x1f) & 1) != 0) +
                                  (uVar1 >> ((byte)uVar5 & 0x1f) & 1) * 2] * 4 + (ulong)(uVar4 << 4)
                           );
          iVar17 = iVar10 + uVar7;
          if (0xfe < iVar17) {
            iVar17 = 0xff;
          }
          if (iVar17 < 1) {
            iVar17 = 0;
          }
          puVar3[-2] = (uint8)iVar17;
          iVar17 = iVar10 + uVar18;
          if (0xfe < iVar17) {
            iVar17 = 0xff;
          }
          if (iVar17 < 1) {
            iVar17 = 0;
          }
          puVar3[-1] = (uint8)iVar17;
          iVar10 = iVar10 + uVar8;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          uVar5 = uVar5 + 1;
          *puVar3 = (uint8)iVar10;
          puVar3 = puVar3 + lVar14 * lVar13;
        }
        puVar11 = puVar11 + lVar13;
      }
    }
    else {
      lVar16 = (long)startx;
      puVar11 = img + (lVar14 * (starty + 2) + lVar16) * lVar13 + 2;
      uVar5 = 2;
      for (; lVar15 = (long)(starty + 2), puVar3 = puVar11, lVar16 < startx + 4; lVar16 = lVar16 + 1
          ) {
        for (; lVar15 < starty + 4; lVar15 = lVar15 + 1) {
          iVar10 = *(int *)((long)compressParams[0] +
                           (long)unscramble
                                 [(uint)((uVar9 >> (uVar5 & 0x1f) & 1) != 0) +
                                  (uVar1 >> ((byte)uVar5 & 0x1f) & 1) * 2] * 4 + (ulong)(uVar4 << 4)
                           );
          iVar17 = iVar10 + uVar7;
          if (0xfe < iVar17) {
            iVar17 = 0xff;
          }
          if (iVar17 < 1) {
            iVar17 = 0;
          }
          puVar3[-2] = (uint8)iVar17;
          iVar17 = iVar10 + uVar18;
          if (0xfe < iVar17) {
            iVar17 = 0xff;
          }
          if (iVar17 < 1) {
            iVar17 = 0;
          }
          puVar3[-1] = (uint8)iVar17;
          iVar10 = iVar10 + uVar8;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          uVar5 = uVar5 + 1;
          *puVar3 = (uint8)iVar10;
          puVar3 = puVar3 + lVar13 * lVar14;
        }
        uVar5 = uVar5 + 2;
        puVar11 = puVar11 + lVar13;
      }
    }
  }
  else {
    uVar7 = block_part1 >> 0x13 & 0x1f;
    uVar8 = block_part1 >> 0xb & 0x1f;
    uVar4 = (block_part1 >> 0x1b) << 3 | block_part1 >> 0x1d;
    uVar18 = block_part1 >> 4 & 0xe;
    uVar1 = block_part2 >> 0x10;
    uVar9 = block_part2 & 0xffff;
    iVar10 = (uVar7 >> 2) + uVar7 * 8;
    iVar17 = (uVar8 >> 2) + uVar8 * 8;
    lVar16 = (long)starty;
    lVar13 = (long)width;
    lVar15 = (long)channels;
    lVar14 = (long)startx;
    if ((block_part1 & 1) == 0) {
      puVar11 = img + (lVar16 * lVar13 + lVar14) * lVar15 + 2;
      uVar5 = 0;
      for (; puVar3 = puVar11, lVar6 = lVar16, lVar14 < startx + 2; lVar14 = lVar14 + 1) {
        for (; lVar6 < starty + 4; lVar6 = lVar6 + 1) {
          iVar12 = *(int *)((long)compressParams[0] +
                           (long)unscramble
                                 [(uint)((uVar9 >> (uVar5 & 0x1f) & 1) != 0) +
                                  (uVar1 >> ((byte)uVar5 & 0x1f) & 1) * 2] * 4 +
                           (ulong)(uVar18 << 4));
          iVar2 = iVar12 + uVar4;
          if (0xfe < iVar2) {
            iVar2 = 0xff;
          }
          if (iVar2 < 1) {
            iVar2 = 0;
          }
          puVar3[-2] = (uint8)iVar2;
          iVar2 = iVar12 + iVar10;
          if (0xfe < iVar2) {
            iVar2 = 0xff;
          }
          if (iVar2 < 1) {
            iVar2 = 0;
          }
          puVar3[-1] = (uint8)iVar2;
          iVar12 = iVar12 + iVar17;
          if (0xfe < iVar12) {
            iVar12 = 0xff;
          }
          if (iVar12 < 1) {
            iVar12 = 0;
          }
          uVar5 = uVar5 + 1;
          *puVar3 = (uint8)iVar12;
          puVar3 = puVar3 + lVar15 * lVar13;
        }
        puVar11 = puVar11 + lVar15;
      }
    }
    else {
      puVar11 = img + (lVar16 * lVar13 + lVar14) * lVar15 + 2;
      uVar5 = 0;
      for (; puVar3 = puVar11, lVar6 = lVar16, lVar14 < startx + 4; lVar14 = lVar14 + 1) {
        for (; lVar6 < starty + 2; lVar6 = lVar6 + 1) {
          iVar12 = *(int *)((long)compressParams[0] +
                           (long)unscramble
                                 [(uint)((uVar9 >> (uVar5 & 0x1f) & 1) != 0) +
                                  (uVar1 >> ((byte)uVar5 & 0x1f) & 1) * 2] * 4 +
                           (ulong)(uVar18 << 4));
          iVar2 = iVar12 + uVar4;
          if (0xfe < iVar2) {
            iVar2 = 0xff;
          }
          if (iVar2 < 1) {
            iVar2 = 0;
          }
          puVar3[-2] = (uint8)iVar2;
          iVar2 = iVar12 + iVar10;
          if (0xfe < iVar2) {
            iVar2 = 0xff;
          }
          if (iVar2 < 1) {
            iVar2 = 0;
          }
          puVar3[-1] = (uint8)iVar2;
          iVar12 = iVar12 + iVar17;
          if (0xfe < iVar12) {
            iVar12 = 0xff;
          }
          if (iVar12 < 1) {
            iVar12 = 0;
          }
          uVar5 = uVar5 + 1;
          *puVar3 = (uint8)iVar12;
          puVar3 = puVar3 + lVar15 * lVar13;
        }
        uVar5 = uVar5 + 2;
        puVar11 = puVar11 + lVar15;
      }
    }
    uVar4 = ((int)(block_part1 << 5) >> 0x1d) + (block_part1 >> 0x1b);
    uVar7 = uVar7 + ((int)(block_part1 << 0xd) >> 0x1d);
    uVar8 = uVar8 + ((int)(block_part1 << 0x15) >> 0x1d);
    uVar18 = block_part1 >> 1 & 0xe;
    uVar5 = uVar4 * 8 & 0xff | (uVar4 & 0xff) >> 2;
    uVar4 = uVar7 * 8 & 0xff | (uVar7 & 0xff) >> 2;
    uVar7 = uVar8 * 8 & 0xff | (uVar8 & 0xff) >> 2;
    if ((block_part1 & 1) == 0) {
      lVar16 = (long)(startx + 2);
      puVar11 = img + (starty * lVar13 + lVar16) * lVar15 + 2;
      uVar8 = 8;
      for (; puVar3 = puVar11, lVar14 = (long)starty, lVar16 < startx + 4; lVar16 = lVar16 + 1) {
        for (; lVar14 < starty + 4; lVar14 = lVar14 + 1) {
          iVar10 = *(int *)((long)compressParams[0] +
                           (long)unscramble
                                 [(uint)((uVar9 >> (uVar8 & 0x1f) & 1) != 0) +
                                  (uVar1 >> ((byte)uVar8 & 0x1f) & 1) * 2] * 4 +
                           (ulong)(uVar18 << 4));
          iVar17 = iVar10 + uVar5;
          if (0xfe < iVar17) {
            iVar17 = 0xff;
          }
          if (iVar17 < 1) {
            iVar17 = 0;
          }
          puVar3[-2] = (uint8)iVar17;
          iVar17 = iVar10 + uVar4;
          if (0xfe < iVar17) {
            iVar17 = 0xff;
          }
          if (iVar17 < 1) {
            iVar17 = 0;
          }
          puVar3[-1] = (uint8)iVar17;
          iVar10 = iVar10 + uVar7;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          uVar8 = uVar8 + 1;
          *puVar3 = (uint8)iVar10;
          puVar3 = puVar3 + lVar13 * lVar15;
        }
        puVar11 = puVar11 + lVar15;
      }
    }
    else {
      lVar16 = (long)startx;
      puVar11 = img + (lVar13 * (starty + 2) + lVar16) * lVar15 + 2;
      uVar8 = 2;
      for (; lVar14 = (long)(starty + 2), puVar3 = puVar11, lVar16 < startx + 4; lVar16 = lVar16 + 1
          ) {
        for (; lVar14 < starty + 4; lVar14 = lVar14 + 1) {
          iVar10 = *(int *)((long)compressParams[0] +
                           (long)unscramble
                                 [(uint)((uVar9 >> (uVar8 & 0x1f) & 1) != 0) +
                                  (uVar1 >> ((byte)uVar8 & 0x1f) & 1) * 2] * 4 +
                           (ulong)(uVar18 << 4));
          iVar17 = iVar10 + uVar5;
          if (0xfe < iVar17) {
            iVar17 = 0xff;
          }
          if (iVar17 < 1) {
            iVar17 = 0;
          }
          puVar3[-2] = (uint8)iVar17;
          iVar17 = iVar10 + uVar4;
          if (0xfe < iVar17) {
            iVar17 = 0xff;
          }
          if (iVar17 < 1) {
            iVar17 = 0;
          }
          puVar3[-1] = (uint8)iVar17;
          iVar10 = iVar10 + uVar7;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          uVar8 = uVar8 + 1;
          *puVar3 = (uint8)iVar10;
          puVar3 = puVar3 + lVar15 * lVar13;
        }
        uVar8 = uVar8 + 2;
        puVar11 = puVar11 + lVar15;
      }
    }
  }
  return;
}

Assistant:

void decompressBlockDiffFlipC(unsigned int block_part1, unsigned int block_part2, uint8 *img, int width, int height, int startx, int starty, int channels)
{
	uint8 avg_color[3], enc_color1[3], enc_color2[3];
	signed char diff[3];
	int table;
	int index,shift;
	int r,g,b;
	int diffbit;
	int flipbit;

	diffbit = (GETBITSHIGH(block_part1, 1, 33));
	flipbit = (GETBITSHIGH(block_part1, 1, 32));

	if( !diffbit )
	{
		// We have diffbit = 0.

		// First decode left part of block.
		avg_color[0]= GETBITSHIGH(block_part1, 4, 63);
		avg_color[1]= GETBITSHIGH(block_part1, 4, 55);
		avg_color[2]= GETBITSHIGH(block_part1, 4, 47);

		// Here, we should really multiply by 17 instead of 16. This can
		// be done by just copying the four lower bits to the upper ones
		// while keeping the lower bits.
		avg_color[0] |= (avg_color[0] <<4);
		avg_color[1] |= (avg_color[1] <<4);
		avg_color[2] |= (avg_color[2] <<4);

		table = GETBITSHIGH(block_part1, 3, 39) << 1;

		unsigned int pixel_indices_MSB, pixel_indices_LSB;
			
		pixel_indices_MSB = GETBITS(block_part2, 16, 31);
		pixel_indices_LSB = GETBITS(block_part2, 16, 15);

		if( (flipbit) == 0 )
		{
			// We should not flip
			shift = 0;
			for(int x=startx; x<startx+2; x++)
			{
				for(int y=starty; y<starty+4; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
			}
		}
		else
		{
			// We should flip
			shift = 0;
			for(int x=startx; x<startx+4; x++)
			{
				for(int y=starty; y<starty+2; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
				shift+=2;
			}
		}

		// Now decode other part of block. 
		avg_color[0]= GETBITSHIGH(block_part1, 4, 59);
		avg_color[1]= GETBITSHIGH(block_part1, 4, 51);
		avg_color[2]= GETBITSHIGH(block_part1, 4, 43);

		// Here, we should really multiply by 17 instead of 16. This can
		// be done by just copying the four lower bits to the upper ones
		// while keeping the lower bits.
		avg_color[0] |= (avg_color[0] <<4);
		avg_color[1] |= (avg_color[1] <<4);
		avg_color[2] |= (avg_color[2] <<4);

		table = GETBITSHIGH(block_part1, 3, 36) << 1;
		pixel_indices_MSB = GETBITS(block_part2, 16, 31);
		pixel_indices_LSB = GETBITS(block_part2, 16, 15);

		if( (flipbit) == 0 )
		{
			// We should not flip
			shift=8;
			for(int x=startx+2; x<startx+4; x++)
			{
				for(int y=starty; y<starty+4; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
			}
		}
		else
		{
			// We should flip
			shift=2;
			for(int x=startx; x<startx+4; x++)
			{
				for(int y=starty+2; y<starty+4; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
				shift += 2;
			}
		}
	}
	else
	{
		// We have diffbit = 1. 

//      63 62 61 60 59 58 57 56 55 54 53 52 51 50 49 48 47 46 45 44 43 42 41 40 39 38 37 36 35 34  33  32 
//      ---------------------------------------------------------------------------------------------------
//     | base col1    | dcol 2 | base col1    | dcol 2 | base col 1   | dcol 2 | table  | table  |diff|flip|
//     | R1' (5 bits) | dR2    | G1' (5 bits) | dG2    | B1' (5 bits) | dB2    | cw 1   | cw 2   |bit |bit |
//      ---------------------------------------------------------------------------------------------------
// 
// 
//     c) bit layout in bits 31 through 0 (in both cases)
// 
//      31 30 29 28 27 26 25 24 23 22 21 20 19 18 17 16 15 14 13 12 11 10  9  8  7  6  5  4  3   2   1  0
//      --------------------------------------------------------------------------------------------------
//     |       most significant pixel index bits       |         least significant pixel index bits       |  
//     | p| o| n| m| l| k| j| i| h| g| f| e| d| c| b| a| p| o| n| m| l| k| j| i| h| g| f| e| d| c | b | a |
//      --------------------------------------------------------------------------------------------------      

		// First decode left part of block.
		enc_color1[0]= GETBITSHIGH(block_part1, 5, 63);
		enc_color1[1]= GETBITSHIGH(block_part1, 5, 55);
		enc_color1[2]= GETBITSHIGH(block_part1, 5, 47);

		// Expand from 5 to 8 bits
		avg_color[0] = (enc_color1[0] <<3) | (enc_color1[0] >> 2);
		avg_color[1] = (enc_color1[1] <<3) | (enc_color1[1] >> 2);
		avg_color[2] = (enc_color1[2] <<3) | (enc_color1[2] >> 2);

		table = GETBITSHIGH(block_part1, 3, 39) << 1;

		unsigned int pixel_indices_MSB, pixel_indices_LSB;
			
		pixel_indices_MSB = GETBITS(block_part2, 16, 31);
		pixel_indices_LSB = GETBITS(block_part2, 16, 15);

		if( (flipbit) == 0 )
		{
			// We should not flip
			shift = 0;
			for(int x=startx; x<startx+2; x++)
			{
				for(int y=starty; y<starty+4; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
			}
		}
		else
		{
			// We should flip
			shift = 0;
			for(int x=startx; x<startx+4; x++)
			{
				for(int y=starty; y<starty+2; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
				shift+=2;
			}
		}

		// Now decode right part of block. 
		diff[0]= GETBITSHIGH(block_part1, 3, 58);
		diff[1]= GETBITSHIGH(block_part1, 3, 50);
		diff[2]= GETBITSHIGH(block_part1, 3, 42);

		// Extend sign bit to entire byte. 
		diff[0] = (diff[0] << 5);
		diff[1] = (diff[1] << 5);
		diff[2] = (diff[2] << 5);
		diff[0] = diff[0] >> 5;
		diff[1] = diff[1] >> 5;
		diff[2] = diff[2] >> 5;

		//  Calculale second color
		enc_color2[0]= enc_color1[0] + diff[0];
		enc_color2[1]= enc_color1[1] + diff[1];
		enc_color2[2]= enc_color1[2] + diff[2];

		// Expand from 5 to 8 bits
		avg_color[0] = (enc_color2[0] <<3) | (enc_color2[0] >> 2);
		avg_color[1] = (enc_color2[1] <<3) | (enc_color2[1] >> 2);
		avg_color[2] = (enc_color2[2] <<3) | (enc_color2[2] >> 2);

		table = GETBITSHIGH(block_part1, 3, 36) << 1;
		pixel_indices_MSB = GETBITS(block_part2, 16, 31);
		pixel_indices_LSB = GETBITS(block_part2, 16, 15);

		if( (flipbit) == 0 )
		{
			// We should not flip
			shift=8;
			for(int x=startx+2; x<startx+4; x++)
			{
				for(int y=starty; y<starty+4; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
			}
		}
		else
		{
			// We should flip
			shift=2;
			for(int x=startx; x<startx+4; x++)
			{
				for(int y=starty+2; y<starty+4; y++)
				{
					index  = ((pixel_indices_MSB >> shift) & 1) << 1;
					index |= ((pixel_indices_LSB >> shift) & 1);
					shift++;
					index=unscramble[index];

 					r=RED_CHANNEL(img,width,x,y,channels)  =CLAMP(0,avg_color[0]+compressParams[table][index],255);
 					g=GREEN_CHANNEL(img,width,x,y,channels)=CLAMP(0,avg_color[1]+compressParams[table][index],255);
 					b=BLUE_CHANNEL(img,width,x,y,channels) =CLAMP(0,avg_color[2]+compressParams[table][index],255);
				}
				shift += 2;
			}
		}
	}
}